

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::Generator::ModuleLevelServiceDescriptorName_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,ServiceDescriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  long lVar3;
  size_type sVar4;
  pointer pcVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  size_type sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  plVar6 = *(long **)descriptor;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar3 = *plVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar3,plVar6[1] + lVar3);
  sVar4 = __return_storage_ptr__->_M_string_length;
  if (sVar4 != 0) {
    pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar9 = 0;
    do {
      cVar2 = pcVar5[sVar9];
      if ((byte)(cVar2 + 0x9fU) < 0x1a) {
        pcVar5[sVar9] = cVar2 + -0x20;
      }
      sVar9 = sVar9 + 1;
    } while (sVar4 != sVar9);
  }
  std::operator+(&local_88,"_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (*(FileDescriptor **)(descriptor + 0x10) != this->file_) {
    anon_unknown_0::ModuleName(&local_48,*(string **)*(FileDescriptor **)(descriptor + 0x10));
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_58 = *plVar7;
      lStack_50 = plVar6[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar7;
      local_68 = (long *)*plVar6;
    }
    local_60 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_68,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p)
    ;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_88.field_2._M_allocated_capacity = *psVar8;
      local_88.field_2._8_8_ = plVar6[3];
      local_88._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar8;
      local_88._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_88._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::ModuleLevelServiceDescriptorName(
    const ServiceDescriptor& descriptor) const {
  string name = descriptor.name();
  UpperString(&name);
  name = "_" + name;
  if (descriptor.file() != file_) {
    name = ModuleName(descriptor.file()->name()) + "." + name;
  }
  return name;
}